

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_CreateInMemoryWaveBank
                   (FACTAudioEngine *pEngine,void *pvBuffer,uint32_t dwSize,uint32_t dwFlags,
                   uint32_t dwAllocAttributes,FACTWaveBank **ppWaveBank)

{
  uint32_t uVar1;
  undefined8 in_RDI;
  uint32_t retval;
  FACTGetOverlappedResultCallback in_stack_000000b0;
  FACTReadFileCallback in_stack_000000b8;
  uint32_t in_stack_000000c0;
  uint32_t in_stack_000000c4;
  void *in_stack_000000c8;
  FACTAudioEngine *in_stack_000000d0;
  uint16_t in_stack_000000f0;
  FACTWaveBank **in_stack_000000f8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x111ad1);
  FAudio_memopen((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_RDI >> 0x20));
  uVar1 = FACT_INTERNAL_ParseWaveBank
                    (in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,
                     in_stack_000000b8,in_stack_000000b0,in_stack_000000f0,in_stack_000000f8);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x111b2e);
  return uVar1;
}

Assistant:

uint32_t FACTAudioEngine_CreateInMemoryWaveBank(
	FACTAudioEngine *pEngine,
	const void *pvBuffer,
	uint32_t dwSize,
	uint32_t dwFlags,
	uint32_t dwAllocAttributes,
	FACTWaveBank **ppWaveBank
) {
	uint32_t retval;
	FAudio_PlatformLockMutex(pEngine->apiLock);
	retval = FACT_INTERNAL_ParseWaveBank(
		pEngine,
		FAudio_memopen((void*) pvBuffer, dwSize),
		0,
		0,
		FACT_INTERNAL_DefaultReadFile,
		FACT_INTERNAL_DefaultGetOverlappedResult,
		0,
		ppWaveBank
	);
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return retval;
}